

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

Own<kj::_::ImmediatePromiseNode<kj::AsyncCapabilityStream::ReadResult>,_kj::_::PromiseDisposer>
__thiscall
kj::_::PromiseDisposer::
alloc<kj::_::ImmediatePromiseNode<kj::AsyncCapabilityStream::ReadResult>,kj::_::PromiseDisposer,kj::AsyncCapabilityStream::ReadResult>
          (PromiseDisposer *this,ReadResult *params)

{
  void *pvVar1;
  ExceptionOr<kj::AsyncCapabilityStream::ReadResult> local_1d0;
  
  pvVar1 = operator_new(0x400);
  local_1d0.super_ExceptionOrValue.exception.ptr.isSet = false;
  local_1d0.value.ptr.isSet = true;
  local_1d0.value.ptr.field_1.value.byteCount = params->byteCount;
  local_1d0.value.ptr.field_1.value.capCount = params->capCount;
  ImmediatePromiseNode<kj::AsyncCapabilityStream::ReadResult>::ImmediatePromiseNode
            ((ImmediatePromiseNode<kj::AsyncCapabilityStream::ReadResult> *)((long)pvVar1 + 0x240),
             &local_1d0);
  if (local_1d0.super_ExceptionOrValue.exception.ptr.isSet == true) {
    Exception::~Exception(&local_1d0.super_ExceptionOrValue.exception.ptr.field_1.value);
  }
  *(void **)((long)pvVar1 + 0x248) = pvVar1;
  *(ImmediatePromiseNode<kj::AsyncCapabilityStream::ReadResult> **)this =
       (ImmediatePromiseNode<kj::AsyncCapabilityStream::ReadResult> *)((long)pvVar1 + 0x240);
  return (Own<kj::_::ImmediatePromiseNode<kj::AsyncCapabilityStream::ReadResult>,_kj::_::PromiseDisposer>
          )(ImmediatePromiseNode<kj::AsyncCapabilityStream::ReadResult> *)this;
}

Assistant:

static kj::Own<T, D> alloc(Params&&... params) noexcept {
    // Implements allocPromise().
    T* ptr;
    if (!canArenaAllocate<T>()) {
      // Node too big (or needs weird alignment), fall back to regular heap allocation.
      ptr = new T(kj::fwd<Params>(params)...);
    } else {
      // Start a new arena.
      //
      // NOTE: As in appendPromise() (below), we don't implement exception-safety because it causes
      //   code bloat and these constructors probably don't throw. Instead this function is
      //   noexcept, so if a constructor does throw, it'll crash rather than leak memory.
      auto* arena = new PromiseArena;
      ptr = reinterpret_cast<T*>(arena + 1) - 1;
      ctor(*ptr, kj::fwd<Params>(params)...);
      ptr->arena = arena;
      KJ_IREQUIRE(reinterpret_cast<void*>(ptr) ==
                  reinterpret_cast<void*>(static_cast<PromiseArenaMember*>(ptr)),
          "PromiseArenaMember must be the leftmost inherited type.");
    }
    return kj::Own<T, D>(ptr);
  }